

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

Expression * __thiscall soul::StructuralParser::parseTernaryOperator(StructuralParser *this)

{
  bool bVar1;
  Expression *args_2;
  Expression *args_3;
  Expression *falseBranch;
  Expression *trueBranch;
  undefined1 local_40 [8];
  Context context;
  Expression *a;
  StructuralParser *this_local;
  
  this_local = (StructuralParser *)parseLogicalOr(this);
  context.parentScope = (Scope *)0x54ca0c;
  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matches(&this->super_SOULTokeniser,(TokenType)0x54ca0c);
  if (bVar1) {
    getContext((Context *)local_40,this);
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::skip(&this->super_SOULTokeniser);
    args_2 = parseTernaryOperator(this);
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x575e29);
    args_3 = parseTernaryOperator(this);
    this_local = (StructuralParser *)
                 allocate<soul::AST::TernaryOp,soul::AST::Context&,soul::AST::Expression&,soul::AST::Expression&,soul::AST::Expression&>
                           (this,(Context *)local_40,(Expression *)this_local,args_2,args_3);
    AST::Context::~Context((Context *)local_40);
  }
  return (Expression *)this_local;
}

Assistant:

AST::Expression& parseTernaryOperator()
    {
        auto& a = parseLogicalOr();

        if (! matches (Operator::question))
            return a;

        auto context = getContext();
        skip();
        auto& trueBranch = parseTernaryOperator();
        expect (Operator::colon);
        auto& falseBranch = parseTernaryOperator();
        return allocate<AST::TernaryOp> (context, a, trueBranch, falseBranch);
    }